

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::date_t,duckdb::DatePart::YearWeekOperator,long>
          (DatePart *this,vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  date_t dVar7;
  date_t dVar8;
  reference stats;
  int32_t ww;
  BaseStatistics result;
  int local_e0 [16];
  LogicalType local_a0 [24];
  int local_88 [22];
  
  stats = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  cVar5 = duckdb::NumericStats::HasMinMax(stats);
  if (cVar5 != '\0') {
    dVar7 = NumericStats::GetMin<duckdb::date_t>(stats);
    dVar8 = NumericStats::GetMax<duckdb::date_t>(stats);
    if (((dVar7.days <= dVar8.days) &&
        (bVar6 = duckdb::Value::IsFinite<duckdb::date_t>(dVar7), bVar6)) &&
       (bVar6 = duckdb::Value::IsFinite<duckdb::date_t>(dVar8), bVar6)) {
      duckdb::Date::ExtractISOYearWeek(dVar7,local_88,local_e0);
      iVar4 = local_88[0];
      iVar3 = local_e0[0];
      duckdb::Date::ExtractISOYearWeek(dVar8,local_88,local_e0);
      iVar1 = -local_e0[0];
      if (0 < local_88[0]) {
        iVar1 = local_e0[0];
      }
      duckdb::LogicalType::LogicalType(local_a0,stats_type);
      duckdb::NumericStats::CreateEmpty(local_88,local_a0);
      iVar2 = -iVar3;
      if (0 < iVar4) {
        iVar2 = iVar3;
      }
      duckdb::LogicalType::~LogicalType(local_a0);
      duckdb::Value::Value((Value *)local_e0,(long)(iVar4 * 100 + iVar2));
      duckdb::NumericStats::SetMin((BaseStatistics *)local_88,(Value *)local_e0);
      duckdb::Value::~Value((Value *)local_e0);
      duckdb::Value::Value((Value *)local_e0,(long)(iVar1 + local_88[0] * 100));
      duckdb::NumericStats::SetMax((BaseStatistics *)local_88,(Value *)local_e0);
      duckdb::Value::~Value((Value *)local_e0);
      vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
      duckdb::BaseStatistics::CopyValidity((BaseStatistics *)local_88);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics((BaseStatistics *)local_88);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}